

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method_property.cpp
# Opt level: O0

void __thiscall MethodProperty_GetOperator_Test::TestBody(MethodProperty_GetOperator_Test *this)

{
  bool bVar1;
  char *pcVar2;
  int *piVar3;
  string *psVar4;
  AssertHelper local_4b8;
  Message local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_19;
  Message local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_18;
  Message local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_17;
  Message local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_16;
  Message local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_15;
  Message local_370;
  int local_368 [2];
  undefined1 local_360 [8];
  AssertionResult gtest_ar_14;
  Message local_348;
  int local_340 [2];
  undefined1 local_338 [8];
  AssertionResult gtest_ar_13;
  Message local_320;
  int local_318 [2];
  undefined1 local_310 [8];
  AssertionResult gtest_ar_12;
  Message local_2f8;
  int local_2f0 [2];
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_11;
  Message local_2d0;
  int local_2c8 [2];
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_10;
  Message local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_9;
  Message local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_8;
  Message local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_7;
  Message local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_6;
  Message local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_5;
  Message local_168;
  int local_160 [2];
  undefined1 local_158 [8];
  AssertionResult gtest_ar_4;
  Message local_140;
  int local_138 [2];
  undefined1 local_130 [8];
  AssertionResult gtest_ar_3;
  Message local_118;
  int local_110 [2];
  undefined1 local_108 [8];
  AssertionResult gtest_ar_2;
  Message local_f0;
  int local_e8 [2];
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_1;
  Message local_c8 [3];
  int local_b0 [2];
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  BasicMethodProperties obj;
  MethodProperty_GetOperator_Test *this_local;
  
  obj._128_8_ = this;
  BasicMethodProperties::BasicMethodProperties((BasicMethodProperties *)&gtest_ar.message_);
  local_b0[1] = 0;
  local_b0[0] = prop::detail::
                PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue>,_prop::ReadOnly,_0UL,_void>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue>_>
                ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue>,_prop::ReadOnly,_0UL,_void>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue>_>
                              *)&obj.m_long_value);
  testing::internal::EqHelper<true>::Compare<int,int>
            (local_a8,"0",(int *)"obj.ro_int_value()",local_b0 + 1,local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x168,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_e8[1] = 0;
  local_e8[0] = prop::detail::
                PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValueCRef>,_prop::ReadOnly,_1UL,_void>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValueCRef>_>
                ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValueCRef>,_prop::ReadOnly,_1UL,_void>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValueCRef>_>
                              *)((long)&obj.m_long_value + 1));
  testing::internal::EqHelper<true>::Compare<int,int>
            (local_e0,"0",(int *)"obj.ro_int_value2()",local_e8 + 1,local_e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x169,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  local_110[1] = 0;
  local_110[0] = prop::detail::
                 PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::setIntValue2>,_4UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>_>
                 ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::setIntValue2>,_4UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>_>
                               *)((long)&obj.m_long_value + 4));
  testing::internal::EqHelper<true>::Compare<int,int>
            (local_108,"0",(int *)"obj.int_value()",local_110 + 1,local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x16a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_138[1] = 0;
  local_138[0] = prop::detail::
                 PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValue2CRef>,_prop::detail::SetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::setIntValue2CRef>,_5UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValue2CRef>_>
                 ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValue2CRef>,_prop::detail::SetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::setIntValue2CRef>,_5UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValue2CRef>_>
                               *)((long)&obj.m_long_value + 5));
  testing::internal::EqHelper<true>::Compare<int,int>
            (local_130,"0",(int *)"obj.int_value2()",local_138 + 1,local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x16b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  local_160[1] = 0;
  local_160[0] = prop::detail::
                 PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2_>,_prop::detail::SetterWrapper<BasicMethodProperties,_int_&&,_&BasicMethodProperties::setIntValue2RVRef>,_6UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2_>_>
                 ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2_>,_prop::detail::SetterWrapper<BasicMethodProperties,_int_&&,_&BasicMethodProperties::setIntValue2RVRef>,_6UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2_>_>
                               *)((long)&obj.m_long_value + 6));
  testing::internal::EqHelper<true>::Compare<int,int>
            (local_158,"0",(int *)"obj.int_value3()",local_160 + 1,local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x16c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue>,_prop::ReadOnly,_2UL,_void>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue>_>
  ::operator()(&local_1a0,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue>,_prop::ReadOnly,_2UL,_void>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue>_>
                *)((long)&obj.m_long_value + 2));
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_180,"\"\"","obj.ro_string_value()",(char (*) [1])0x1827b7,
             &local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x16d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValueCRef>,_prop::ReadOnly,_3UL,_void>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValueCRef>_>
  ::operator()(&local_1e0,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValueCRef>,_prop::ReadOnly,_3UL,_void>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValueCRef>_>
                *)((long)&obj.m_long_value + 3));
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_1c0,"\"\"","obj.ro_string_value2()",(char (*) [1])0x1827b7,
             &local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x16e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::setStringValue2>,_7UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>_>
  ::operator()(&local_220,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::setStringValue2>,_7UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>_>
                *)((long)&obj.m_long_value + 7));
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_200,"\"\"","obj.string_value()",(char (*) [1])0x1827b7,
             &local_220);
  std::__cxx11::string::~string((string *)&local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x16f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValue2CRef>,_prop::detail::SetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::setStringValue2CRef>,_8UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValue2CRef>_>
  ::operator()(&local_260,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValue2CRef>,_prop::detail::SetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::setStringValue2CRef>,_8UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValue2CRef>_>
                *)&obj.field_0x78);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_240,"\"\"","obj.string_value2()",(char (*) [1])0x1827b7,
             &local_260);
  std::__cxx11::string::~string((string *)&local_260);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x170,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2_>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&,_&BasicMethodProperties::setStringValue2RVRef>,_9UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2_>_>
  ::operator()(&local_2a0,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2_>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&,_&BasicMethodProperties::setStringValue2RVRef>,_9UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2_>_>
                *)&obj.field_0x79);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_280,"\"\"","obj.string_value3()",(char (*) [1])0x1827b7,
             &local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x171,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  piVar3 = BasicMethodProperties::getIntValueTest((BasicMethodProperties *)&gtest_ar.message_);
  *piVar3 = 0x56;
  psVar4 = BasicMethodProperties::getStringValueTest_abi_cxx11_
                     ((BasicMethodProperties *)&gtest_ar.message_);
  std::__cxx11::string::operator=((string *)psVar4,"bob");
  piVar3 = BasicMethodProperties::getIntValue2Test((BasicMethodProperties *)&gtest_ar.message_);
  *piVar3 = 0x22;
  psVar4 = BasicMethodProperties::getStringValue2Test_abi_cxx11_
                     ((BasicMethodProperties *)&gtest_ar.message_);
  std::__cxx11::string::operator=((string *)psVar4,"bill");
  local_2c8[1] = 0x56;
  local_2c8[0] = prop::detail::
                 PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue>,_prop::ReadOnly,_0UL,_void>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue>_>
                 ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue>,_prop::ReadOnly,_0UL,_void>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue>_>
                               *)&obj.m_long_value);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_2c0,"86","obj.ro_int_value()",local_2c8 + 1,local_2c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x178,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  local_2f0[1] = 0x56;
  local_2f0[0] = prop::detail::
                 PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValueCRef>,_prop::ReadOnly,_1UL,_void>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValueCRef>_>
                 ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValueCRef>,_prop::ReadOnly,_1UL,_void>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValueCRef>_>
                               *)((long)&obj.m_long_value + 1));
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_2e8,"86","obj.ro_int_value2()",local_2f0 + 1,local_2f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x179,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  local_318[1] = 0x22;
  local_318[0] = prop::detail::
                 PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::setIntValue2>,_4UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>_>
                 ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::setIntValue2>,_4UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2>_>
                               *)((long)&obj.m_long_value + 4));
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_310,"34","obj.int_value()",local_318 + 1,local_318);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x17a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  local_340[1] = 0x22;
  local_340[0] = prop::detail::
                 PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValue2CRef>,_prop::detail::SetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::setIntValue2CRef>,_5UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValue2CRef>_>
                 ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValue2CRef>,_prop::detail::SetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::setIntValue2CRef>,_5UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_const_int_&,_&BasicMethodProperties::getIntValue2CRef>_>
                               *)((long)&obj.m_long_value + 5));
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_338,"34","obj.int_value2()",local_340 + 1,local_340);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x17b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  local_368[1] = 0x22;
  local_368[0] = prop::detail::
                 PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2_>,_prop::detail::SetterWrapper<BasicMethodProperties,_int_&&,_&BasicMethodProperties::setIntValue2RVRef>,_6UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2_>_>
                 ::operator()((PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2_>,_prop::detail::SetterWrapper<BasicMethodProperties,_int_&&,_&BasicMethodProperties::setIntValue2RVRef>,_6UL,_prop::ReadWrite>,_BasicMethodProperties,_int,_prop::detail::GetterWrapper<BasicMethodProperties,_int,_&BasicMethodProperties::getIntValue2_>_>
                               *)((long)&obj.m_long_value + 6));
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_360,"34","obj.int_value3()",local_368 + 1,local_368);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x17c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue>,_prop::ReadOnly,_2UL,_void>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue>_>
  ::operator()(&local_3a8,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue>,_prop::ReadOnly,_2UL,_void>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue>_>
                *)((long)&obj.m_long_value + 2));
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((EqHelper<false> *)local_388,"\"bob\"","obj.ro_string_value()",(char (*) [4])"bob",
             &local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar1) {
    testing::Message::Message(&local_3b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x17d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValueCRef>,_prop::ReadOnly,_3UL,_void>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValueCRef>_>
  ::operator()(&local_3e8,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValueCRef>,_prop::ReadOnly,_3UL,_void>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValueCRef>_>
                *)((long)&obj.m_long_value + 3));
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((EqHelper<false> *)local_3c8,"\"bob\"","obj.ro_string_value2()",(char (*) [4])"bob",
             &local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_3f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x17e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::setStringValue2>,_7UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>_>
  ::operator()(&local_428,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::setStringValue2>,_7UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>_>
                *)((long)&obj.m_long_value + 7));
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_408,"\"bill\"","obj.string_value()",(char (*) [5])"bill",
             &local_428);
  std::__cxx11::string::~string((string *)&local_428);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x17f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValue2CRef>,_prop::detail::SetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::setStringValue2CRef>,_8UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValue2CRef>_>
  ::operator()(&local_468,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValue2CRef>,_prop::detail::SetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::setStringValue2CRef>,_8UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValue2CRef>_>
                *)&obj.field_0x78);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_448,"\"bill\"","obj.string_value2()",(char (*) [5])"bill",
             &local_468);
  std::__cxx11::string::~string((string *)&local_468);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x180,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_470);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  prop::detail::
  PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2_>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&,_&BasicMethodProperties::setStringValue2RVRef>,_9UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2_>_>
  ::operator()(&local_4a8,
               (PropertyMethodBase<prop::MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2_>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&,_&BasicMethodProperties::setStringValue2RVRef>,_9UL,_prop::ReadWrite>,_BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2_>_>
                *)&obj.field_0x79);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_488,"\"bill\"","obj.string_value3()",(char (*) [5])"bill",
             &local_4a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_4b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              (&local_4b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x181,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
    testing::internal::AssertHelper::~AssertHelper(&local_4b8);
    testing::Message::~Message(&local_4b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  BasicMethodProperties::~BasicMethodProperties((BasicMethodProperties *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(MethodProperty, GetOperator)
{
  BasicMethodProperties obj;
  
  EXPECT_EQ( 0, obj.ro_int_value() );
  EXPECT_EQ( 0, obj.ro_int_value2() );
  EXPECT_EQ( 0, obj.int_value() );
  EXPECT_EQ( 0, obj.int_value2() );
  EXPECT_EQ( 0, obj.int_value3() );
  EXPECT_EQ( "", obj.ro_string_value() );
  EXPECT_EQ( "", obj.ro_string_value2() );
  EXPECT_EQ( "", obj.string_value() );
  EXPECT_EQ( "", obj.string_value2() );
  EXPECT_EQ( "", obj.string_value3() );

  obj.getIntValueTest() = 86;
  obj.getStringValueTest() = "bob";
  obj.getIntValue2Test() = 34;
  obj.getStringValue2Test() = "bill";
  
  EXPECT_EQ( 86, obj.ro_int_value() );
  EXPECT_EQ( 86, obj.ro_int_value2() );
  EXPECT_EQ( 34, obj.int_value() );
  EXPECT_EQ( 34, obj.int_value2() );
  EXPECT_EQ( 34, obj.int_value3() );
  EXPECT_EQ( "bob", obj.ro_string_value() );
  EXPECT_EQ( "bob", obj.ro_string_value2() );
  EXPECT_EQ( "bill", obj.string_value() );
  EXPECT_EQ( "bill", obj.string_value2() );
  EXPECT_EQ( "bill", obj.string_value3() );
}